

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O3

int u8_offset(char *str,int charnum)

{
  int iVar1;
  int iVar2;
  char *string;
  
  iVar2 = (int)str;
  if (0 < charnum) {
    iVar1 = charnum + 1;
    do {
      if (*str == '\0') break;
      str = str + 1;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  return (int)str - iVar2;
}

Assistant:

int u8_offset(const char *str, int charnum)
{
    const char *string = str;

    while (charnum > 0 && *string != '\0') {
        if (*string++ & 0x80) {
            if (!isutf(*string)) {
                ++string;
                if (!isutf(*string)) {
                    ++string;
                    if (!isutf(*string)) {
                        ++string;
                    }
                }
            }
        }
        --charnum;
    }

    return (int)(string - str);
}